

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlUTF8Strlen(xmlChar *utf)

{
  int iVar1;
  ulong uVar2;
  xmlChar xVar3;
  
  iVar1 = -1;
  if (utf != (xmlChar *)0x0) {
    uVar2 = 0;
    xVar3 = *utf;
    while (xVar3 != '\0') {
      utf = utf + 1;
      if ((char)xVar3 < '\0') {
        return -1;
      }
      uVar2 = uVar2 + 1;
      xVar3 = *utf;
    }
    iVar1 = (int)uVar2;
    if (0x7fffffff < uVar2) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlUTF8Strlen(const xmlChar *utf) {
    size_t ret = 0;

    if (utf == NULL)
        return(-1);

    while (*utf != 0) {
        if (utf[0] & 0x80) {
            if ((utf[1] & 0xc0) != 0x80)
                return(-1);
            if ((utf[0] & 0xe0) == 0xe0) {
                if ((utf[2] & 0xc0) != 0x80)
                    return(-1);
                if ((utf[0] & 0xf0) == 0xf0) {
                    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
                        return(-1);
                    utf += 4;
                } else {
                    utf += 3;
                }
            } else {
                utf += 2;
            }
        } else {
            utf++;
        }
        ret++;
    }
    return(ret > INT_MAX ? 0 : ret);
}